

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre_regex.cpp
# Opt level: O1

void __thiscall booster::regex::assign(regex *this,string *pattern,int flags)

{
  int iVar1;
  int iVar2;
  data *pdVar3;
  pcre *ppVar4;
  ostream *this_00;
  runtime_error *prVar5;
  int offset;
  char *err_ptr;
  string anchored;
  int local_1cc;
  char *local_1c8;
  string local_1c0;
  string local_1a0 [11];
  
  pdVar3 = (data *)operator_new(0x50);
  (pdVar3->expression)._M_dataplus._M_p = (pointer)&(pdVar3->expression).field_2;
  (pdVar3->expression)._M_string_length = 0;
  (pdVar3->expression).field_2._M_local_buf[0] = '\0';
  pdVar3->flags = 0;
  pdVar3->re = (pcre *)0x0;
  pdVar3->are = (pcre *)0x0;
  pdVar3->re_size = 0;
  pdVar3->are_size = 0;
  pdVar3->match_size = 0;
  copy_ptr<booster::regex::data>::reset(&this->d,pdVar3);
  std::__cxx11::string::_M_assign((string *)(this->d).ptr_);
  ((this->d).ptr_)->flags = flags;
  local_1c8 = (char *)0x0;
  local_1cc = 0;
  iVar2 = ((uint)flags >> 8 & 1) + (flags & 0x200U) * 4;
  ppVar4 = (pcre *)pcre_compile((pattern->_M_dataplus)._M_p,iVar2,&local_1c8,&local_1cc,0);
  if (ppVar4 == (pcre *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"booster::regex:",0xf);
    this_00 = std::operator<<((ostream *)local_1a0,local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>(this_00,", at offset ",0xc);
    std::ostream::operator<<((ostream *)this_00,local_1cc);
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
    std::__cxx11::stringbuf::str();
    runtime_error::runtime_error(prVar5,&local_1c0);
    *(undefined ***)prVar5 = &PTR__runtime_error_001d3620;
    (prVar5->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__regex_error_001d3648;
    __cxa_throw(prVar5,&regex_error::typeinfo,runtime_error::~runtime_error);
  }
  pdVar3 = (this->d).ptr_;
  pdVar3->re = ppVar4;
  iVar1 = pcre_fullinfo(ppVar4,0,1,&pdVar3->re_size);
  if (-1 < iVar1) {
    pdVar3 = (this->d).ptr_;
    iVar1 = pcre_fullinfo(pdVar3->re,0,2,&pdVar3->match_size);
    if (-1 < iVar1) {
      local_1a0[0]._M_string_length = 0;
      local_1a0[0].field_2._M_local_buf[0] = '\0';
      local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
      std::__cxx11::string::reserve((ulong)local_1a0);
      std::__cxx11::string::append((char *)local_1a0);
      std::__cxx11::string::_M_append((char *)local_1a0,(ulong)(pattern->_M_dataplus)._M_p);
      std::__cxx11::string::append((char *)local_1a0);
      ppVar4 = (pcre *)pcre_compile(local_1a0[0]._M_dataplus._M_p,iVar2,&local_1c8,&local_1cc,0);
      if (ppVar4 == (pcre *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1c0,"booster::regex: Internal error","");
        runtime_error::runtime_error(prVar5,&local_1c0);
        *(undefined ***)prVar5 = &PTR__runtime_error_001d3620;
        (prVar5->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__regex_error_001d3648;
        __cxa_throw(prVar5,&regex_error::typeinfo,runtime_error::~runtime_error);
      }
      pdVar3 = (this->d).ptr_;
      pdVar3->are = ppVar4;
      iVar2 = pcre_fullinfo(ppVar4,0,1,&pdVar3->are_size);
      if (iVar2 == 0) {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0[0]._M_dataplus._M_p != &local_1a0[0].field_2) {
          operator_delete(local_1a0[0]._M_dataplus._M_p);
        }
        return;
      }
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1c0,"booster::regex: Internal error","");
      runtime_error::runtime_error(prVar5,&local_1c0);
      *(undefined ***)prVar5 = &PTR__runtime_error_001d3620;
      (prVar5->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__regex_error_001d3648;
      __cxa_throw(prVar5,&regex_error::typeinfo,runtime_error::~runtime_error);
    }
  }
  prVar5 = (runtime_error *)__cxa_allocate_exception(0x30);
  local_1a0[0]._M_dataplus._M_p = (pointer)&local_1a0[0].field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"booster::regex: Internal error","");
  runtime_error::runtime_error(prVar5,local_1a0);
  *(undefined ***)prVar5 = &PTR__runtime_error_001d3620;
  (prVar5->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__regex_error_001d3648;
  __cxa_throw(prVar5,&regex_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

void regex::assign(std::string const &pattern,int flags)
	{
		d.reset(new data());
		d->expression=pattern;
		d->flags = flags;
		char const *err_ptr = 0;
		int offset = 0;
		int pcre_flags = 0;
		if(flags & icase) {
			pcre_flags |= PCRE_CASELESS;
		}
		if(flags & utf8) {
			#ifndef PCRE_UTF8
			throw regex_error("PCRE Library does not support UTF-8 please upgrade");
			#else
			pcre_flags |= PCRE_UTF8;
			#endif
		}
		pcre *p=pcre_compile(pattern.c_str(),pcre_flags,&err_ptr,&offset,0);
		if(!p) {
			std::ostringstream ss;
			ss << "booster::regex:" << err_ptr <<", at offset "<<offset;
			throw regex_error(ss.str());
		}
		d->re = p;
		if(	pcre_fullinfo(d->re,NULL,PCRE_INFO_SIZE,&d->re_size) < 0
			|| pcre_fullinfo(d->re,NULL,PCRE_INFO_CAPTURECOUNT,&d->match_size) < 0)
		{
			throw regex_error("booster::regex: Internal error");
		}
		
		std::string anchored;
		anchored.reserve(pattern.size()+6);
		anchored+= "(?:";
		anchored+=pattern;
		anchored+=")\\z";

		p=pcre_compile(anchored.c_str(),pcre_flags,&err_ptr,&offset,0);
		if(!p) {
			throw regex_error("booster::regex: Internal error");
		}
		d->are = p;
		if(pcre_fullinfo(d->are,NULL,PCRE_INFO_SIZE,&d->are_size) != 0)
		{
			throw regex_error("booster::regex: Internal error");
		}
	}